

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_avx2_256_8.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_scan_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i *palVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i alVar6;
  byte bVar7;
  uint uVar8;
  void *pvVar9;
  parasail_matrix_t *ppVar10;
  void *pvVar11;
  void *pvVar12;
  __m256i alVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m256i alVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  char cVar27;
  byte bVar28;
  char cVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  parasail_result_t *ppVar33;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *ptr;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  __m256i *ptr_05;
  int8_t *ptr_06;
  char cVar34;
  int iVar35;
  uint uVar36;
  char *pcVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  char *__format;
  int8_t iVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  int32_t segNum;
  uint uVar45;
  long lVar46;
  uint uVar47;
  long lVar48;
  uint uVar49;
  int iVar50;
  ulong uVar51;
  bool bVar52;
  undefined1 uVar53;
  char cVar54;
  undefined1 auVar55 [16];
  undefined1 auVar60 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar63 [32];
  __m256i alVar64;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar72 [32];
  undefined1 in_ZMM15 [64];
  __m256i_8_t h;
  undefined1 in_stack_fffffffffffffc00 [16];
  uint uVar73;
  undefined4 uVar74;
  byte bVar75;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_220 [32];
  undefined1 local_1e0 [32];
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  local_300._0_4_ = s1_beg;
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar37 = "profile";
  }
  else {
    pvVar9 = (profile->profile8).score;
    if (pvVar9 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar37 = "profile->profile8.score";
    }
    else {
      ppVar10 = profile->matrix;
      if (ppVar10 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar37 = "profile->matrix";
      }
      else {
        uVar8 = profile->s1Len;
        if ((int)uVar8 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar37 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar37 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar37 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar37 = "open";
        }
        else {
          if (-1 < gap) {
            uVar39 = uVar8 - 1;
            uVar51 = (ulong)uVar8 + 0x1f >> 5;
            iVar30 = ppVar10->min;
            pvVar11 = (profile->profile8).matches;
            iVar50 = -open;
            uVar32 = (uint)(byte)-(char)iVar30;
            if (iVar30 != iVar50 && SBORROW4(iVar30,iVar50) == iVar30 + open < 0) {
              uVar32 = open;
            }
            pvVar12 = (profile->profile8).similar;
            cVar27 = '~' - (char)ppVar10->max;
            ppVar33 = parasail_result_new_stats();
            if (ppVar33 != (parasail_result_t *)0x0) {
              local_320._0_4_ = iVar50;
              uVar49 = (uint)((ulong)uVar39 % uVar51);
              ppVar33->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar33->flag | 0x20110402;
              b = parasail_memalign___m256i(0x20,uVar51);
              b_00 = parasail_memalign___m256i(0x20,uVar51);
              b_01 = parasail_memalign___m256i(0x20,uVar51);
              b_02 = parasail_memalign___m256i(0x20,uVar51);
              ptr = parasail_memalign___m256i(0x20,uVar51);
              b_03 = parasail_memalign___m256i(0x20,uVar51);
              uVar73 = (uint)uVar51;
              uVar74 = 0;
              b_04 = parasail_memalign___m256i(0x20,uVar51);
              b_05 = parasail_memalign___m256i(0x20,uVar51);
              ptr_00 = parasail_memalign___m256i(0x20,CONCAT44(uVar74,uVar73));
              ptr_01 = parasail_memalign___m256i(0x20,CONCAT44(uVar74,uVar73));
              ptr_02 = parasail_memalign___m256i(0x20,CONCAT44(uVar74,uVar73));
              ptr_03 = parasail_memalign___m256i(0x20,CONCAT44(uVar74,uVar73));
              ptr_04 = parasail_memalign___m256i(0x20,CONCAT44(uVar74,uVar73));
              ptr_05 = parasail_memalign___m256i(0x20,CONCAT44(uVar74,uVar73));
              ptr_06 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
              auVar62._8_8_ = 0;
              auVar62._0_8_ = b;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = b_00;
              auVar62 = vpunpcklqdq_avx(auVar62,auVar65);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = b_01;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = b_02;
              auVar65 = vpunpcklqdq_avx(auVar55,auVar60);
              auVar55 = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar62;
              auVar60 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = ptr;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = b_03;
              auVar62 = vpunpcklqdq_avx(auVar61,auVar66);
              auVar67._8_8_ = 0;
              auVar67._0_8_ = b_04;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = b_05;
              auVar65 = vpunpcklqdq_avx(auVar67,auVar68);
              auVar62 = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar62;
              auVar65 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65;
              auVar56._0_8_ = -(ulong)(auVar55._0_8_ == 0);
              auVar56._8_8_ = -(ulong)(auVar55._8_8_ == 0);
              auVar56._16_8_ = -(ulong)(auVar60._0_8_ == 0);
              auVar56._24_8_ = -(ulong)(auVar60._8_8_ == 0);
              auVar63._0_8_ = -(ulong)(auVar62._0_8_ == 0);
              auVar63._8_8_ = -(ulong)(auVar62._8_8_ == 0);
              auVar63._16_8_ = -(ulong)(auVar65._0_8_ == 0);
              auVar63._24_8_ = -(ulong)(auVar65._8_8_ == 0);
              auVar56 = vpackssdw_avx2(auVar56,auVar63);
              if (((((ptr_04 != (__m256i *)0x0 && ptr_03 != (__m256i *)0x0) &&
                    ptr_05 != (__m256i *)0x0) &&
                   ((ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0) &&
                   ptr_02 != (__m256i *)0x0)) && ptr_06 != (int8_t *)0x0) &&
                  ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar56 >> 0x7f,0) == '\0') &&
                     (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar56 >> 0xbf,0) == '\0') &&
                   (auVar56 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar56[0x1f])) {
                iVar30 = s2Len + -1;
                iVar35 = 0x1f - (int)(uVar39 / uVar51);
                uVar53 = (undefined1)open;
                cVar54 = (char)gap;
                bVar28 = (char)uVar32 + 0x81;
                uVar32 = CONCAT31((int3)(uVar32 >> 8),bVar28);
                local_1e0[1] = (undefined1)iVar35;
                local_1e0[0] = local_1e0[1];
                local_1e0[2] = local_1e0[1];
                local_1e0[3] = local_1e0[1];
                local_1e0[4] = local_1e0[1];
                local_1e0[5] = local_1e0[1];
                local_1e0[6] = local_1e0[1];
                local_1e0[7] = local_1e0[1];
                local_1e0[8] = local_1e0[1];
                local_1e0[9] = local_1e0[1];
                local_1e0[10] = local_1e0[1];
                local_1e0[0xb] = local_1e0[1];
                local_1e0[0xc] = local_1e0[1];
                local_1e0[0xd] = local_1e0[1];
                local_1e0[0xe] = local_1e0[1];
                local_1e0[0xf] = local_1e0[1];
                local_1e0[0x10] = local_1e0[1];
                local_1e0[0x11] = local_1e0[1];
                local_1e0[0x12] = local_1e0[1];
                local_1e0[0x13] = local_1e0[1];
                local_1e0[0x14] = local_1e0[1];
                local_1e0[0x15] = local_1e0[1];
                local_1e0[0x16] = local_1e0[1];
                local_1e0[0x17] = local_1e0[1];
                local_1e0[0x18] = local_1e0[1];
                local_1e0[0x19] = local_1e0[1];
                local_1e0[0x1a] = local_1e0[1];
                local_1e0[0x1b] = local_1e0[1];
                local_1e0[0x1c] = local_1e0[1];
                local_1e0[0x1d] = local_1e0[1];
                local_1e0[0x1e] = local_1e0[1];
                local_1e0[0x1f] = local_1e0[1];
                auVar57[0] = (char)uVar73;
                auVar57[1] = auVar57[0];
                auVar57[2] = auVar57[0];
                auVar57[3] = auVar57[0];
                auVar57[4] = auVar57[0];
                auVar57[5] = auVar57[0];
                auVar57[6] = auVar57[0];
                auVar57[7] = auVar57[0];
                auVar57[8] = auVar57[0];
                auVar57[9] = auVar57[0];
                auVar57[10] = auVar57[0];
                auVar57[0xb] = auVar57[0];
                auVar57[0xc] = auVar57[0];
                auVar57[0xd] = auVar57[0];
                auVar57[0xe] = auVar57[0];
                auVar57[0xf] = auVar57[0];
                auVar57[0x10] = auVar57[0];
                auVar57[0x11] = auVar57[0];
                auVar57[0x12] = auVar57[0];
                auVar57[0x13] = auVar57[0];
                auVar57[0x14] = auVar57[0];
                auVar57[0x15] = auVar57[0];
                auVar57[0x16] = auVar57[0];
                auVar57[0x17] = auVar57[0];
                auVar57[0x18] = auVar57[0];
                auVar57[0x19] = auVar57[0];
                auVar57[0x1a] = auVar57[0];
                auVar57[0x1b] = auVar57[0];
                auVar57[0x1c] = auVar57[0];
                auVar57[0x1d] = auVar57[0];
                auVar57[0x1e] = auVar57[0];
                auVar57[0x1f] = auVar57[0];
                auVar56 = vpmovsxwq_avx2(ZEXT816(0xffffffffffffff00));
                auVar63 = vpand_avx2(auVar57,auVar56);
                cVar29 = -(auVar57[0] * cVar54);
                auVar58[1] = cVar29;
                auVar58[0] = cVar29;
                auVar58[2] = cVar29;
                auVar58[3] = cVar29;
                auVar58[4] = cVar29;
                auVar58[5] = cVar29;
                auVar58[6] = cVar29;
                auVar58[7] = cVar29;
                auVar58[8] = cVar29;
                auVar58[9] = cVar29;
                auVar58[10] = cVar29;
                auVar58[0xb] = cVar29;
                auVar58[0xc] = cVar29;
                auVar58[0xd] = cVar29;
                auVar58[0xe] = cVar29;
                auVar58[0xf] = cVar29;
                auVar58[0x10] = cVar29;
                auVar58[0x11] = cVar29;
                auVar58[0x12] = cVar29;
                auVar58[0x13] = cVar29;
                auVar58[0x14] = cVar29;
                auVar58[0x15] = cVar29;
                auVar58[0x16] = cVar29;
                auVar58[0x17] = cVar29;
                auVar58[0x18] = cVar29;
                auVar58[0x19] = cVar29;
                auVar58[0x1a] = cVar29;
                auVar58[0x1b] = cVar29;
                auVar58[0x1c] = cVar29;
                auVar58[0x1d] = cVar29;
                auVar58[0x1e] = cVar29;
                auVar58[0x1f] = cVar29;
                auVar56 = vpand_avx2(auVar58,auVar56);
                auVar56 = vpaddsb_avx2(ZEXT132(bVar28),auVar56);
                alVar13[2]._0_4_ = uVar73;
                alVar13[0] = in_stack_fffffffffffffc00._0_8_;
                alVar13[1] = in_stack_fffffffffffffc00._8_8_;
                alVar13[2]._4_4_ = uVar74;
                alVar13[3]._0_4_ = uVar32;
                alVar13[3]._4_4_ = uVar49;
                parasail_memset___m256i(b_03,alVar13,CONCAT44(uVar74,uVar73));
                alVar21[2]._0_4_ = uVar73;
                alVar21[0] = in_stack_fffffffffffffc00._0_8_;
                alVar21[1] = in_stack_fffffffffffffc00._8_8_;
                alVar21[2]._4_4_ = uVar74;
                alVar21[3]._0_4_ = uVar32;
                alVar21[3]._4_4_ = uVar49;
                parasail_memset___m256i(b_04,alVar21,CONCAT44(uVar74,uVar73));
                alVar2[2]._0_4_ = uVar73;
                alVar2[0] = in_stack_fffffffffffffc00._0_8_;
                alVar2[1] = in_stack_fffffffffffffc00._8_8_;
                alVar2[2]._4_4_ = uVar74;
                alVar2[3]._0_4_ = uVar32;
                alVar2[3]._4_4_ = uVar49;
                parasail_memset___m256i(b_05,alVar2,CONCAT44(uVar74,uVar73));
                alVar6[2]._0_4_ = uVar73;
                alVar6[0] = in_stack_fffffffffffffc00._0_8_;
                alVar6[1] = in_stack_fffffffffffffc00._8_8_;
                alVar6[2]._4_4_ = uVar74;
                alVar6[3]._0_4_ = uVar32;
                alVar6[3]._4_4_ = uVar49;
                parasail_memset___m256i(b,alVar6,CONCAT44(uVar74,uVar73));
                c[2]._0_4_ = uVar73;
                c[0] = in_stack_fffffffffffffc00._0_8_;
                c[1] = in_stack_fffffffffffffc00._8_8_;
                c[2]._4_4_ = uVar74;
                c[3]._0_4_ = uVar32;
                c[3]._4_4_ = uVar49;
                parasail_memset___m256i(b_00,c,CONCAT44(uVar74,uVar73));
                c_00[2]._0_4_ = uVar73;
                c_00[0] = in_stack_fffffffffffffc00._0_8_;
                c_00[1] = in_stack_fffffffffffffc00._8_8_;
                c_00[2]._4_4_ = uVar74;
                c_00[3]._0_4_ = uVar32;
                c_00[3]._4_4_ = uVar49;
                parasail_memset___m256i(b_01,c_00,CONCAT44(uVar74,uVar73));
                c_01[2]._0_4_ = uVar73;
                c_01[0] = in_stack_fffffffffffffc00._0_8_;
                c_01[1] = in_stack_fffffffffffffc00._8_8_;
                c_01[2]._4_4_ = uVar74;
                c_01[3]._0_4_ = uVar32;
                c_01[3]._4_4_ = uVar49;
                parasail_memset___m256i(b_02,c_01,CONCAT44(uVar74,uVar73));
                auVar19[1] = uVar53;
                auVar19[0] = uVar53;
                auVar19[2] = uVar53;
                auVar19[3] = uVar53;
                auVar19[4] = uVar53;
                auVar19[5] = uVar53;
                auVar19[6] = uVar53;
                auVar19[7] = uVar53;
                auVar19[8] = uVar53;
                auVar19[9] = uVar53;
                auVar19[10] = uVar53;
                auVar19[0xb] = uVar53;
                auVar19[0xc] = uVar53;
                auVar19[0xd] = uVar53;
                auVar19[0xe] = uVar53;
                auVar19[0xf] = uVar53;
                auVar19[0x10] = uVar53;
                auVar19[0x11] = uVar53;
                auVar19[0x12] = uVar53;
                auVar19[0x13] = uVar53;
                auVar19[0x14] = uVar53;
                auVar19[0x15] = uVar53;
                auVar19[0x16] = uVar53;
                auVar19[0x17] = uVar53;
                auVar19[0x18] = uVar53;
                auVar19[0x19] = uVar53;
                auVar19[0x1a] = uVar53;
                auVar19[0x1b] = uVar53;
                auVar19[0x1c] = uVar53;
                auVar19[0x1d] = uVar53;
                auVar19[0x1e] = uVar53;
                auVar19[0x1f] = uVar53;
                alVar21 = (__m256i)vpsubsb_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar19);
                alVar64[1]._0_1_ = 1;
                alVar64[0] = 0x101010101010101;
                alVar64[1]._1_1_ = 1;
                alVar64[1]._2_1_ = 1;
                alVar64[1]._3_1_ = 1;
                alVar64[1]._4_1_ = 1;
                alVar64[1]._5_1_ = 1;
                alVar64[1]._6_1_ = 1;
                alVar64[1]._7_1_ = 1;
                alVar64[2]._0_1_ = 1;
                alVar64[2]._1_1_ = 1;
                alVar64[2]._2_1_ = 1;
                alVar64[2]._3_1_ = 1;
                alVar64[2]._4_1_ = 1;
                alVar64[2]._5_1_ = 1;
                alVar64[2]._6_1_ = 1;
                alVar64[2]._7_1_ = 1;
                alVar64[3]._0_1_ = 1;
                alVar64[3]._1_1_ = 1;
                alVar64[3]._2_1_ = 1;
                alVar64[3]._3_1_ = 1;
                alVar64[3]._4_1_ = 1;
                alVar64[3]._5_1_ = 1;
                alVar64[3]._6_1_ = 1;
                alVar64[3]._7_1_ = 1;
                uVar31 = uVar73 - 1;
                alVar13 = alVar64;
                for (uVar36 = uVar31; -1 < (int)uVar36; uVar36 = uVar36 - 1) {
                  ptr_04[uVar36] = alVar21;
                  ptr_05[uVar36] = alVar13;
                  auVar15[1] = cVar54;
                  auVar15[0] = cVar54;
                  auVar15[2] = cVar54;
                  auVar15[3] = cVar54;
                  auVar15[4] = cVar54;
                  auVar15[5] = cVar54;
                  auVar15[6] = cVar54;
                  auVar15[7] = cVar54;
                  auVar15[8] = cVar54;
                  auVar15[9] = cVar54;
                  auVar15[10] = cVar54;
                  auVar15[0xb] = cVar54;
                  auVar15[0xc] = cVar54;
                  auVar15[0xd] = cVar54;
                  auVar15[0xe] = cVar54;
                  auVar15[0xf] = cVar54;
                  auVar15[0x10] = cVar54;
                  auVar15[0x11] = cVar54;
                  auVar15[0x12] = cVar54;
                  auVar15[0x13] = cVar54;
                  auVar15[0x14] = cVar54;
                  auVar15[0x15] = cVar54;
                  auVar15[0x16] = cVar54;
                  auVar15[0x17] = cVar54;
                  auVar15[0x18] = cVar54;
                  auVar15[0x19] = cVar54;
                  auVar15[0x1a] = cVar54;
                  auVar15[0x1b] = cVar54;
                  auVar15[0x1c] = cVar54;
                  auVar15[0x1d] = cVar54;
                  auVar15[0x1e] = cVar54;
                  auVar15[0x1f] = cVar54;
                  alVar21 = (__m256i)vpsubsb_avx2((undefined1  [32])alVar21,auVar15);
                  alVar13 = (__m256i)vpaddsb_avx2((undefined1  [32])alVar13,
                                                  (undefined1  [32])alVar64);
                }
                lVar38 = (long)iVar50;
                for (lVar42 = 0; lVar42 != CONCAT44(uVar74,uVar73); lVar42 = lVar42 + 1) {
                  lVar44 = lVar38;
                  for (lVar46 = 0; lVar46 != 0x20; lVar46 = lVar46 + 1) {
                    lVar48 = lVar44;
                    if (s1_beg != 0) {
                      lVar48 = 0;
                    }
                    if (lVar48 < -0x7f) {
                      lVar48 = -0x80;
                    }
                    *(char *)((long)&local_80 + lVar46) = (char)lVar48;
                    lVar44 = lVar44 - CONCAT44(uVar74,uVar73) * (ulong)(uint)gap;
                  }
                  palVar1 = ptr + lVar42;
                  (*palVar1)[0] = local_80;
                  (*palVar1)[1] = lStack_78;
                  (*palVar1)[2] = lStack_70;
                  (*palVar1)[3] = lStack_68;
                  lVar38 = lVar38 - (ulong)(uint)gap;
                }
                *ptr_06 = '\0';
                for (uVar51 = 1; s2Len + 1 != uVar51; uVar51 = uVar51 + 1) {
                  iVar41 = -0x80;
                  if (-0x80 < (int)local_320._0_4_) {
                    iVar41 = local_320[0];
                  }
                  if (s2_beg != 0) {
                    iVar41 = '\0';
                  }
                  ptr_06[uVar51] = iVar41;
                  local_320._0_4_ = local_320._0_4_ - gap;
                }
                lVar38 = CONCAT44(uVar74,uVar73) << 5;
                auVar15 = vpcmpeqb_avx2(local_1e0,_DAT_008a59e0);
                auVar20[1] = cVar27;
                auVar20[0] = cVar27;
                auVar20[2] = cVar27;
                auVar20[3] = cVar27;
                auVar20[4] = cVar27;
                auVar20[5] = cVar27;
                auVar20[6] = cVar27;
                auVar20[7] = cVar27;
                auVar20[8] = cVar27;
                auVar20[9] = cVar27;
                auVar20[10] = cVar27;
                auVar20[0xb] = cVar27;
                auVar20[0xc] = cVar27;
                auVar20[0xd] = cVar27;
                auVar20[0xe] = cVar27;
                auVar20[0xf] = cVar27;
                auVar20[0x10] = cVar27;
                auVar20[0x11] = cVar27;
                auVar20[0x12] = cVar27;
                auVar20[0x13] = cVar27;
                auVar20[0x14] = cVar27;
                auVar20[0x15] = cVar27;
                auVar20[0x16] = cVar27;
                auVar20[0x17] = cVar27;
                auVar20[0x18] = cVar27;
                auVar20[0x19] = cVar27;
                auVar20[0x1a] = cVar27;
                auVar20[0x1b] = cVar27;
                auVar20[0x1c] = cVar27;
                auVar20[0x1d] = cVar27;
                auVar20[0x1e] = cVar27;
                auVar20[0x1f] = cVar27;
                auVar14[1] = bVar28;
                auVar14[0] = bVar28;
                auVar14[2] = bVar28;
                auVar14[3] = bVar28;
                auVar14[4] = bVar28;
                auVar14[5] = bVar28;
                auVar14[6] = bVar28;
                auVar14[7] = bVar28;
                auVar14[8] = bVar28;
                auVar14[9] = bVar28;
                auVar14[10] = bVar28;
                auVar14[0xb] = bVar28;
                auVar14[0xc] = bVar28;
                auVar14[0xd] = bVar28;
                auVar14[0xe] = bVar28;
                auVar14[0xf] = bVar28;
                auVar14[0x10] = bVar28;
                auVar14[0x11] = bVar28;
                auVar14[0x12] = bVar28;
                auVar14[0x13] = bVar28;
                auVar14[0x14] = bVar28;
                auVar14[0x15] = bVar28;
                auVar14[0x16] = bVar28;
                auVar14[0x17] = bVar28;
                auVar14[0x18] = bVar28;
                auVar14[0x19] = bVar28;
                auVar14[0x1a] = bVar28;
                auVar14[0x1b] = bVar28;
                auVar14[0x1c] = bVar28;
                auVar14[0x1d] = bVar28;
                auVar14[0x1e] = bVar28;
                auVar14[0x1f] = bVar28;
                uVar51 = 0;
                auVar58 = auVar14;
                auVar57 = auVar14;
                auVar19 = auVar14;
                auVar18 = auVar14;
                iVar50 = iVar30;
                while (uVar40 = uVar51, uVar40 != (uint)s2Len) {
                  alVar13 = b_03[uVar31];
                  alVar21 = b_04[uVar31];
                  alVar2 = b_05[uVar31];
                  auVar62 = SUB3216(ptr[uVar31],0);
                  auVar69._0_16_ = ZEXT116(0) * auVar62 + ZEXT116(1) * alVar13._0_16_;
                  auVar69._16_16_ = ZEXT116(0) * alVar13._16_16_ + ZEXT116(1) * auVar62;
                  auVar69 = vpalignr_avx2((undefined1  [32])ptr[uVar31],auVar69,0xf);
                  auVar59 = vperm2i128_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar13,0x28
                                           );
                  auVar59 = vpalignr_avx2((undefined1  [32])alVar13,auVar59,0xf);
                  auVar25 = vperm2i128_avx2((undefined1  [32])alVar21,(undefined1  [32])alVar21,0x28
                                           );
                  auVar25 = vpalignr_avx2((undefined1  [32])alVar21,auVar25,0xf);
                  auVar26 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
                  auVar26 = vpalignr_avx2((undefined1  [32])alVar2,auVar26,0xf);
                  auVar62 = vpinsrb_avx(auVar69._0_16_,(uint)(byte)ptr_06[uVar40],0);
                  auVar24 = vpblendd_avx2(auVar69,ZEXT1632(auVar62),0xf);
                  lVar42 = (long)(int)(ppVar10->mapper[(byte)s2[uVar40]] * uVar73) * 0x20;
                  auVar17[1] = bVar28;
                  auVar17[0] = bVar28;
                  auVar17[2] = bVar28;
                  auVar17[3] = bVar28;
                  auVar17[4] = bVar28;
                  auVar17[5] = bVar28;
                  auVar17[6] = bVar28;
                  auVar17[7] = bVar28;
                  auVar17[8] = bVar28;
                  auVar17[9] = bVar28;
                  auVar17[10] = bVar28;
                  auVar17[0xb] = bVar28;
                  auVar17[0xc] = bVar28;
                  auVar17[0xd] = bVar28;
                  auVar17[0xe] = bVar28;
                  auVar17[0xf] = bVar28;
                  auVar17[0x10] = bVar28;
                  auVar17[0x11] = bVar28;
                  auVar17[0x12] = bVar28;
                  auVar17[0x13] = bVar28;
                  auVar17[0x14] = bVar28;
                  auVar17[0x15] = bVar28;
                  auVar17[0x16] = bVar28;
                  auVar17[0x17] = bVar28;
                  auVar17[0x18] = bVar28;
                  auVar17[0x19] = bVar28;
                  auVar17[0x1a] = bVar28;
                  auVar17[0x1b] = bVar28;
                  auVar17[0x1c] = bVar28;
                  auVar17[0x1d] = bVar28;
                  auVar17[0x1e] = bVar28;
                  auVar17[0x1f] = bVar28;
                  auVar22 = vpsubsb_avx2(auVar17,(undefined1  [32])*ptr_04);
                  local_320 = ZEXT1632(ZEXT816(0));
                  local_220 = ZEXT1632(ZEXT816(0));
                  local_340 = ZEXT1632(ZEXT816(0));
                  auVar69 = in_ZMM14._0_32_;
                  auVar72 = in_ZMM15._0_32_;
                  for (lVar44 = 0; lVar38 != lVar44; lVar44 = lVar44 + 0x20) {
                    auVar3 = *(undefined1 (*) [32])((long)*ptr + lVar44);
                    auVar4 = *(undefined1 (*) [32])((long)*b_03 + lVar44);
                    auVar70 = *(undefined1 (*) [32])((long)*b_04 + lVar44);
                    auVar5 = *(undefined1 (*) [32])((long)*b_05 + lVar44);
                    auVar22 = vpaddsb_avx2(auVar22,*(undefined1 (*) [32])((long)*ptr_04 + lVar44));
                    auVar16 = vpcmpgtb_avx2(auVar22,auVar17);
                    local_320 = vpblendvb_avx2(local_320,auVar69,auVar16);
                    local_220 = vpblendvb_avx2(local_220,auVar72,auVar16);
                    auVar69 = vpaddsb_avx2(local_300,*(undefined1 (*) [32])((long)*ptr_05 + lVar44))
                    ;
                    local_340 = vpblendvb_avx2(local_340,auVar69,auVar16);
                    auVar72[1] = uVar53;
                    auVar72[0] = uVar53;
                    auVar72[2] = uVar53;
                    auVar72[3] = uVar53;
                    auVar72[4] = uVar53;
                    auVar72[5] = uVar53;
                    auVar72[6] = uVar53;
                    auVar72[7] = uVar53;
                    auVar72[8] = uVar53;
                    auVar72[9] = uVar53;
                    auVar72[10] = uVar53;
                    auVar72[0xb] = uVar53;
                    auVar72[0xc] = uVar53;
                    auVar72[0xd] = uVar53;
                    auVar72[0xe] = uVar53;
                    auVar72[0xf] = uVar53;
                    auVar72[0x10] = uVar53;
                    auVar72[0x11] = uVar53;
                    auVar72[0x12] = uVar53;
                    auVar72[0x13] = uVar53;
                    auVar72[0x14] = uVar53;
                    auVar72[0x15] = uVar53;
                    auVar72[0x16] = uVar53;
                    auVar72[0x17] = uVar53;
                    auVar72[0x18] = uVar53;
                    auVar72[0x19] = uVar53;
                    auVar72[0x1a] = uVar53;
                    auVar72[0x1b] = uVar53;
                    auVar72[0x1c] = uVar53;
                    auVar72[0x1d] = uVar53;
                    auVar72[0x1e] = uVar53;
                    auVar72[0x1f] = uVar53;
                    auVar23 = vpsubsb_avx2(auVar3,auVar72);
                    auVar16[1] = cVar54;
                    auVar16[0] = cVar54;
                    auVar16[2] = cVar54;
                    auVar16[3] = cVar54;
                    auVar16[4] = cVar54;
                    auVar16[5] = cVar54;
                    auVar16[6] = cVar54;
                    auVar16[7] = cVar54;
                    auVar16[8] = cVar54;
                    auVar16[9] = cVar54;
                    auVar16[10] = cVar54;
                    auVar16[0xb] = cVar54;
                    auVar16[0xc] = cVar54;
                    auVar16[0xd] = cVar54;
                    auVar16[0xe] = cVar54;
                    auVar16[0xf] = cVar54;
                    auVar16[0x10] = cVar54;
                    auVar16[0x11] = cVar54;
                    auVar16[0x12] = cVar54;
                    auVar16[0x13] = cVar54;
                    auVar16[0x14] = cVar54;
                    auVar16[0x15] = cVar54;
                    auVar16[0x16] = cVar54;
                    auVar16[0x17] = cVar54;
                    auVar16[0x18] = cVar54;
                    auVar16[0x19] = cVar54;
                    auVar16[0x1a] = cVar54;
                    auVar16[0x1b] = cVar54;
                    auVar16[0x1c] = cVar54;
                    auVar16[0x1d] = cVar54;
                    auVar16[0x1e] = cVar54;
                    auVar16[0x1f] = cVar54;
                    auVar71 = vpsubsb_avx2(*(undefined1 (*) [32])((long)*b + lVar44),auVar16);
                    auVar16 = vpcmpgtb_avx2(auVar23,auVar71);
                    auVar69 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + lVar44),auVar4,
                                             auVar16);
                    auVar72 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + lVar44),auVar70,
                                             auVar16);
                    auVar23 = vpmaxsb_avx2(auVar23,auVar71);
                    auVar71[8] = 1;
                    auVar71._0_8_ = 0x101010101010101;
                    auVar71[9] = 1;
                    auVar71[10] = 1;
                    auVar71[0xb] = 1;
                    auVar71[0xc] = 1;
                    auVar71[0xd] = 1;
                    auVar71[0xe] = 1;
                    auVar71[0xf] = 1;
                    auVar71[0x10] = 1;
                    auVar71[0x11] = 1;
                    auVar71[0x12] = 1;
                    auVar71[0x13] = 1;
                    auVar71[0x14] = 1;
                    auVar71[0x15] = 1;
                    auVar71[0x16] = 1;
                    auVar71[0x17] = 1;
                    auVar71[0x18] = 1;
                    auVar71[0x19] = 1;
                    auVar71[0x1a] = 1;
                    auVar71[0x1b] = 1;
                    auVar71[0x1c] = 1;
                    auVar71[0x1d] = 1;
                    auVar71[0x1e] = 1;
                    auVar71[0x1f] = 1;
                    auVar16 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + lVar44),auVar5,
                                             auVar16);
                    auVar26 = vpaddsb_avx2(auVar71,auVar26);
                    auVar16 = vpaddsb_avx2(auVar16,auVar71);
                    auVar24 = vpaddsb_avx2(auVar24,*(undefined1 (*) [32])
                                                    ((long)pvVar9 + lVar44 + lVar42));
                    auVar59 = vpaddsb_avx2(auVar59,*(undefined1 (*) [32])
                                                    ((long)pvVar11 + lVar44 + lVar42));
                    auVar25 = vpaddsb_avx2(auVar25,*(undefined1 (*) [32])
                                                    ((long)pvVar12 + lVar44 + lVar42));
                    auVar17 = vpmaxsb_avx2(auVar17,auVar22);
                    auVar22 = vpcmpgtb_avx2(auVar23,auVar24);
                    *(undefined1 (*) [32])((long)*b + lVar44) = auVar23;
                    *(undefined1 (*) [32])((long)*b_00 + lVar44) = auVar69;
                    auVar69 = vpblendvb_avx2(auVar59,auVar69,auVar22);
                    *(undefined1 (*) [32])((long)*b_01 + lVar44) = auVar72;
                    auVar72 = vpblendvb_avx2(auVar25,auVar72,auVar22);
                    local_300 = vpblendvb_avx2(auVar26,auVar16,auVar22);
                    *(undefined1 (*) [32])((long)*b_02 + lVar44) = auVar16;
                    *(undefined1 (*) [32])((long)*ptr + lVar44) = auVar24;
                    *(undefined1 (*) [32])((long)*b_03 + lVar44) = auVar59;
                    *(undefined1 (*) [32])((long)*b_04 + lVar44) = auVar25;
                    auVar22 = vpmaxsb_avx2(auVar23,auVar24);
                    *(undefined1 (*) [32])((long)*b_05 + lVar44) = auVar26;
                    auVar26 = auVar5;
                    auVar59 = auVar4;
                    auVar25 = auVar70;
                    auVar24 = auVar3;
                  }
                  auVar59._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar26._0_16_;
                  auVar59._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * auVar22._0_16_;
                  auVar59 = vpalignr_avx2(auVar22,auVar59,0xf);
                  auVar25 = vperm2i128_avx2(auVar69,auVar69,0x28);
                  auVar25 = vpalignr_avx2(auVar69,auVar25,0xf);
                  auVar69 = vperm2i128_avx2(auVar72,auVar72,0x28);
                  auVar26 = vpalignr_avx2(auVar72,auVar69,0xf);
                  auVar69 = vperm2i128_avx2(local_300,local_300,0x28);
                  local_300 = vpalignr_avx2(local_300,auVar69,0xf);
                  auVar62 = vpinsrb_avx(auVar59._0_16_,(uint)(byte)ptr_06[uVar40 + 1],0);
                  auVar24 = vpblendd_avx2(auVar59,ZEXT1632(auVar62),0xf);
                  auVar69 = vpaddsb_avx2(auVar24,(undefined1  [32])*ptr_04);
                  auVar22 = vpcmpgtb_avx2(auVar17,auVar69);
                  auVar17 = vpmaxsb_avx2(auVar17,auVar69);
                  in_ZMM14 = ZEXT3264(auVar25);
                  auVar72 = vpblendvb_avx2(auVar25,local_320,auVar22);
                  in_ZMM15 = ZEXT3264(auVar26);
                  auVar59 = vpblendvb_avx2(auVar26,local_220,auVar22);
                  auVar69 = vpaddsb_avx2(local_300,(undefined1  [32])*ptr_05);
                  auVar69 = vpblendvb_avx2(auVar69,local_340,auVar22);
                  iVar43 = 0x1e;
                  while( true ) {
                    auVar22 = vperm2i128_avx2(auVar17,auVar17,0x28);
                    bVar52 = iVar43 == 0;
                    iVar43 = iVar43 + -1;
                    if (bVar52) break;
                    auVar22 = vpalignr_avx2(auVar17,auVar22,0xf);
                    auVar22 = vpaddsb_avx2(auVar22,auVar56);
                    auVar3 = vperm2i128_avx2(auVar72,auVar72,0x28);
                    auVar4 = vpalignr_avx2(auVar72,auVar3,0xf);
                    auVar3 = vperm2i128_avx2(auVar59,auVar59,0x28);
                    auVar70 = vpalignr_avx2(auVar59,auVar3,0xf);
                    auVar3 = vperm2i128_avx2(auVar69,auVar69,0x28);
                    auVar3 = vpalignr_avx2(auVar69,auVar3,0xf);
                    auVar3 = vpaddsb_avx2(auVar3,auVar63);
                    auVar5 = vpcmpgtb_avx2(auVar17,auVar22);
                    auVar17 = vpmaxsb_avx2(auVar17,auVar22);
                    auVar72 = vpblendvb_avx2(auVar4,auVar72,auVar5);
                    auVar59 = vpblendvb_avx2(auVar70,auVar59,auVar5);
                    auVar69 = vpblendvb_avx2(auVar3,auVar69,auVar5);
                  }
                  auVar17 = vpalignr_avx2(auVar17,auVar22,0xf);
                  auVar22 = vperm2i128_avx2(auVar72,auVar72,0x28);
                  auVar72 = vpalignr_avx2(auVar72,auVar22,0xf);
                  auVar22 = vperm2i128_avx2(auVar59,auVar59,0x28);
                  auVar22 = vpalignr_avx2(auVar59,auVar22,0xf);
                  auVar59 = vperm2i128_avx2(auVar69,auVar69,0x28);
                  auVar59 = vpalignr_avx2(auVar69,auVar59,0xf);
                  auVar69 = vpaddsb_avx2(auVar17,ZEXT132(bVar28));
                  auVar17 = vpcmpgtb_avx2(auVar69,auVar24);
                  auVar25 = vpblendvb_avx2(auVar25,auVar72,auVar17);
                  auVar26 = vpblendvb_avx2(auVar26,auVar22,auVar17);
                  auVar24 = vpmaxsb_avx2(auVar69,auVar24);
                  auVar17 = vpblendvb_avx2(local_300,auVar59,auVar17);
                  for (lVar42 = 0; lVar38 != lVar42; lVar42 = lVar42 + 0x20) {
                    auVar3[1] = uVar53;
                    auVar3[0] = uVar53;
                    auVar3[2] = uVar53;
                    auVar3[3] = uVar53;
                    auVar3[4] = uVar53;
                    auVar3[5] = uVar53;
                    auVar3[6] = uVar53;
                    auVar3[7] = uVar53;
                    auVar3[8] = uVar53;
                    auVar3[9] = uVar53;
                    auVar3[10] = uVar53;
                    auVar3[0xb] = uVar53;
                    auVar3[0xc] = uVar53;
                    auVar3[0xd] = uVar53;
                    auVar3[0xe] = uVar53;
                    auVar3[0xf] = uVar53;
                    auVar3[0x10] = uVar53;
                    auVar3[0x11] = uVar53;
                    auVar3[0x12] = uVar53;
                    auVar3[0x13] = uVar53;
                    auVar3[0x14] = uVar53;
                    auVar3[0x15] = uVar53;
                    auVar3[0x16] = uVar53;
                    auVar3[0x17] = uVar53;
                    auVar3[0x18] = uVar53;
                    auVar3[0x19] = uVar53;
                    auVar3[0x1a] = uVar53;
                    auVar3[0x1b] = uVar53;
                    auVar3[0x1c] = uVar53;
                    auVar3[0x1d] = uVar53;
                    auVar3[0x1e] = uVar53;
                    auVar3[0x1f] = uVar53;
                    auVar24 = vpsubsb_avx2(auVar24,auVar3);
                    auVar4[1] = cVar54;
                    auVar4[0] = cVar54;
                    auVar4[2] = cVar54;
                    auVar4[3] = cVar54;
                    auVar4[4] = cVar54;
                    auVar4[5] = cVar54;
                    auVar4[6] = cVar54;
                    auVar4[7] = cVar54;
                    auVar4[8] = cVar54;
                    auVar4[9] = cVar54;
                    auVar4[10] = cVar54;
                    auVar4[0xb] = cVar54;
                    auVar4[0xc] = cVar54;
                    auVar4[0xd] = cVar54;
                    auVar4[0xe] = cVar54;
                    auVar4[0xf] = cVar54;
                    auVar4[0x10] = cVar54;
                    auVar4[0x11] = cVar54;
                    auVar4[0x12] = cVar54;
                    auVar4[0x13] = cVar54;
                    auVar4[0x14] = cVar54;
                    auVar4[0x15] = cVar54;
                    auVar4[0x16] = cVar54;
                    auVar4[0x17] = cVar54;
                    auVar4[0x18] = cVar54;
                    auVar4[0x19] = cVar54;
                    auVar4[0x1a] = cVar54;
                    auVar4[0x1b] = cVar54;
                    auVar4[0x1c] = cVar54;
                    auVar4[0x1d] = cVar54;
                    auVar4[0x1e] = cVar54;
                    auVar4[0x1f] = cVar54;
                    auVar3 = vpsubsb_avx2(auVar69,auVar4);
                    auVar69 = vpcmpgtb_avx2(auVar24,auVar3);
                    auVar72 = vpblendvb_avx2(auVar72,auVar25,auVar69);
                    auVar22 = vpblendvb_avx2(auVar22,auVar26,auVar69);
                    auVar17 = vpblendvb_avx2(auVar59,auVar17,auVar69);
                    auVar59 = *(undefined1 (*) [32])((long)*ptr + lVar42);
                    auVar70[8] = 1;
                    auVar70._0_8_ = 0x101010101010101;
                    auVar70[9] = 1;
                    auVar70[10] = 1;
                    auVar70[0xb] = 1;
                    auVar70[0xc] = 1;
                    auVar70[0xd] = 1;
                    auVar70[0xe] = 1;
                    auVar70[0xf] = 1;
                    auVar70[0x10] = 1;
                    auVar70[0x11] = 1;
                    auVar70[0x12] = 1;
                    auVar70[0x13] = 1;
                    auVar70[0x14] = 1;
                    auVar70[0x15] = 1;
                    auVar70[0x16] = 1;
                    auVar70[0x17] = 1;
                    auVar70[0x18] = 1;
                    auVar70[0x19] = 1;
                    auVar70[0x1a] = 1;
                    auVar70[0x1b] = 1;
                    auVar70[0x1c] = 1;
                    auVar70[0x1d] = 1;
                    auVar70[0x1e] = 1;
                    auVar70[0x1f] = 1;
                    auVar69 = vpmaxsb_avx2(auVar24,auVar3);
                    auVar25 = vpmaxsb_avx2(auVar59,*(undefined1 (*) [32])((long)*b + lVar42));
                    auVar24 = vpmaxsb_avx2(auVar25,auVar69);
                    auVar4 = vpcmpgtb_avx2(auVar25,auVar69);
                    auVar25 = vpblendvb_avx2(auVar72,*(undefined1 (*) [32])((long)*b_00 + lVar42),
                                             auVar4);
                    auVar3 = vpcmpeqb_avx2(auVar24,auVar59);
                    auVar25 = vpblendvb_avx2(auVar25,*(undefined1 (*) [32])((long)*b_03 + lVar42),
                                             auVar3);
                    auVar59 = vpblendvb_avx2(auVar22,*(undefined1 (*) [32])((long)*b_01 + lVar42),
                                             auVar4);
                    auVar26 = vpblendvb_avx2(auVar59,*(undefined1 (*) [32])((long)*b_04 + lVar42),
                                             auVar3);
                    auVar59 = vpaddsb_avx2(auVar17,auVar70);
                    auVar17 = vpblendvb_avx2(auVar59,*(undefined1 (*) [32])((long)*b_02 + lVar42),
                                             auVar4);
                    auVar17 = vpblendvb_avx2(auVar17,*(undefined1 (*) [32])((long)*b_05 + lVar42),
                                             auVar3);
                    *(undefined1 (*) [32])((long)*ptr + lVar42) = auVar24;
                    *(undefined1 (*) [32])((long)*b_03 + lVar42) = auVar25;
                    *(undefined1 (*) [32])((long)*b_04 + lVar42) = auVar26;
                    *(undefined1 (*) [32])((long)*b_05 + lVar42) = auVar17;
                    auVar20 = vpminsb_avx2(auVar20,auVar24);
                    auVar18 = vpmaxsb_avx2(auVar18,auVar24);
                    auVar18 = vpmaxsb_avx2(auVar18,auVar25);
                    auVar3 = vpmaxsb_avx2(auVar26,auVar17);
                    auVar18 = vpmaxsb_avx2(auVar18,auVar3);
                  }
                  alVar13 = ptr[uVar49];
                  auVar69 = vpcmpgtb_avx2((undefined1  [32])alVar13,auVar19);
                  auVar57 = vpblendvb_avx2(auVar57,(undefined1  [32])b_03[uVar49],auVar69);
                  auVar19 = vpmaxsb_avx2(auVar19,(undefined1  [32])alVar13);
                  auVar58 = vpblendvb_avx2(auVar58,(undefined1  [32])b_04[uVar49],auVar69);
                  auVar14 = vpblendvb_avx2(auVar14,(undefined1  [32])b_05[uVar49],auVar69);
                  auVar69 = vpand_avx2(auVar69,auVar15);
                  uVar51 = uVar40 + 1;
                  if ((((((((((((((((((((((((((((((((auVar69 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar69 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar69 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar69 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar69 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar69 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar69 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar69 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar69 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar69 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar69 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar69 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar69 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar69 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar69 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar69 >> 0x7f,0) != '\0')
                                    || (auVar69 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar69 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar69 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar69 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar69 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar69 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar69 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar69 >> 0xbf,0) != '\0') ||
                            (auVar69 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar69 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar69 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar69 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar69 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar69 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar69 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar69[0x1f] < '\0') {
                    iVar50 = (int)uVar40;
                  }
                }
                uVar36 = 0;
                if (s2_end == 0) {
                  cVar29 = '\0';
                  cVar54 = '\0';
                }
                else {
                  for (; (int)uVar36 < iVar35; uVar36 = uVar36 + 1) {
                    auVar56 = vperm2i128_avx2(auVar19,auVar19,0x28);
                    auVar19 = vpalignr_avx2(auVar19,auVar56,0xf);
                    auVar56 = vperm2i128_avx2(auVar57,auVar57,0x28);
                    auVar57 = vpalignr_avx2(auVar57,auVar56,0xf);
                    auVar56 = vperm2i128_avx2(auVar58,auVar58,0x28);
                    auVar58 = vpalignr_avx2(auVar58,auVar56,0xf);
                    auVar56 = vperm2i128_avx2(auVar14,auVar14,0x28);
                    auVar14 = vpalignr_avx2(auVar14,auVar56,0xf);
                  }
                  uVar32 = (uint)auVar19[0x17];
                  uVar36 = (uint)auVar57[0x17];
                  cVar29 = auVar58[0x17];
                  cVar54 = auVar14[0x17];
                }
                bVar75 = (byte)uVar32;
                cVar34 = (char)uVar36;
                uVar31 = uVar39;
                if (s1_end != 0) {
                  uVar51 = 0;
                  while( true ) {
                    bVar75 = (byte)uVar32;
                    cVar34 = (char)uVar36;
                    if ((uVar73 & 0x3ffffff) << 5 == (uint)uVar51) break;
                    uVar45 = ((uint)uVar51 & 0x1f) * uVar73 + ((uint)(uVar51 >> 5) & 0x7ffffff);
                    uVar47 = uVar32;
                    if ((int)uVar45 < (int)uVar8) {
                      bVar7 = *(byte *)((long)*ptr + uVar51);
                      uVar47 = (uint)bVar7;
                      if (((char)bVar75 < (char)bVar7) ||
                         (((uVar47 = uVar32, bVar7 == bVar75 && (iVar50 == iVar30)) &&
                          ((int)uVar45 < (int)uVar31)))) {
                        uVar36 = (uint)*(byte *)((long)*b_03 + uVar51);
                        cVar29 = *(char *)((long)*b_04 + uVar51);
                        cVar54 = *(char *)((long)*b_05 + uVar51);
                        uVar31 = uVar45;
                        iVar50 = iVar30;
                      }
                    }
                    uVar51 = uVar51 + 1;
                    uVar32 = uVar47;
                  }
                }
                if (s2_end == 0 && s1_end == 0) {
                  alVar13 = ptr[uVar49];
                  alVar21 = b_03[uVar49];
                  alVar2 = b_04[uVar49];
                  alVar6 = b_05[uVar49];
                  for (iVar50 = 0; iVar50 < iVar35; iVar50 = iVar50 + 1) {
                    auVar56 = vperm2i128_avx2((undefined1  [32])alVar13,(undefined1  [32])alVar13,
                                              0x28);
                    alVar13 = (__m256i)vpalignr_avx2((undefined1  [32])alVar13,auVar56,0xf);
                    auVar56 = vperm2i128_avx2((undefined1  [32])alVar21,(undefined1  [32])alVar21,
                                              0x28);
                    alVar21 = (__m256i)vpalignr_avx2((undefined1  [32])alVar21,auVar56,0xf);
                    auVar56 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28
                                             );
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar56,0xf);
                    auVar56 = vperm2i128_avx2((undefined1  [32])alVar6,(undefined1  [32])alVar6,0x28
                                             );
                    alVar6 = (__m256i)vpalignr_avx2((undefined1  [32])alVar6,auVar56,0xf);
                  }
                  bVar75 = alVar13[2]._7_1_;
                  cVar34 = alVar21[2]._7_1_;
                  cVar29 = alVar2[2]._7_1_;
                  cVar54 = alVar6[2]._7_1_;
                  uVar31 = uVar39;
                  iVar50 = iVar30;
                }
                auVar25[1] = bVar28;
                auVar25[0] = bVar28;
                auVar25[2] = bVar28;
                auVar25[3] = bVar28;
                auVar25[4] = bVar28;
                auVar25[5] = bVar28;
                auVar25[6] = bVar28;
                auVar25[7] = bVar28;
                auVar25[8] = bVar28;
                auVar25[9] = bVar28;
                auVar25[10] = bVar28;
                auVar25[0xb] = bVar28;
                auVar25[0xc] = bVar28;
                auVar25[0xd] = bVar28;
                auVar25[0xe] = bVar28;
                auVar25[0xf] = bVar28;
                auVar25[0x10] = bVar28;
                auVar25[0x11] = bVar28;
                auVar25[0x12] = bVar28;
                auVar25[0x13] = bVar28;
                auVar25[0x14] = bVar28;
                auVar25[0x15] = bVar28;
                auVar25[0x16] = bVar28;
                auVar25[0x17] = bVar28;
                auVar25[0x18] = bVar28;
                auVar25[0x19] = bVar28;
                auVar25[0x1a] = bVar28;
                auVar25[0x1b] = bVar28;
                auVar25[0x1c] = bVar28;
                auVar25[0x1d] = bVar28;
                auVar25[0x1e] = bVar28;
                auVar25[0x1f] = bVar28;
                auVar56 = vpcmpgtb_avx2(auVar25,auVar20);
                auVar26[1] = cVar27;
                auVar26[0] = cVar27;
                auVar26[2] = cVar27;
                auVar26[3] = cVar27;
                auVar26[4] = cVar27;
                auVar26[5] = cVar27;
                auVar26[6] = cVar27;
                auVar26[7] = cVar27;
                auVar26[8] = cVar27;
                auVar26[9] = cVar27;
                auVar26[10] = cVar27;
                auVar26[0xb] = cVar27;
                auVar26[0xc] = cVar27;
                auVar26[0xd] = cVar27;
                auVar26[0xe] = cVar27;
                auVar26[0xf] = cVar27;
                auVar26[0x10] = cVar27;
                auVar26[0x11] = cVar27;
                auVar26[0x12] = cVar27;
                auVar26[0x13] = cVar27;
                auVar26[0x14] = cVar27;
                auVar26[0x15] = cVar27;
                auVar26[0x16] = cVar27;
                auVar26[0x17] = cVar27;
                auVar26[0x18] = cVar27;
                auVar26[0x19] = cVar27;
                auVar26[0x1a] = cVar27;
                auVar26[0x1b] = cVar27;
                auVar26[0x1c] = cVar27;
                auVar26[0x1d] = cVar27;
                auVar26[0x1e] = cVar27;
                auVar26[0x1f] = cVar27;
                auVar63 = vpcmpgtb_avx2(auVar18,auVar26);
                auVar56 = vpor_avx2(auVar63,auVar56);
                if ((((((((((((((((((((((((((((((((auVar56 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar56 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar56 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar56 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar56 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar56 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar56 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar56 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar56 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar56 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar56 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar56 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar56 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar56 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar56 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar56 >> 0x7f,0) != '\0') ||
                                  (auVar56 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar56 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar56 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar56 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar56 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar56 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar56 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar56 >> 0xbf,0) != '\0') ||
                          (auVar56 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar56 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar56 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar56 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar56 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar56 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar56 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar56[0x1f] < '\0') {
                  *(byte *)&ppVar33->flag = (byte)ppVar33->flag | 0x40;
                  bVar75 = 0;
                  cVar34 = '\0';
                  cVar29 = '\0';
                  cVar54 = '\0';
                  iVar50 = 0;
                  uVar31 = 0;
                }
                ppVar33->score = (int)(char)bVar75;
                ppVar33->end_query = uVar31;
                ppVar33->end_ref = iVar50;
                *(int *)(ppVar33->field_4).extra = (int)cVar34;
                ((ppVar33->field_4).stats)->similar = (int)cVar29;
                ((ppVar33->field_4).stats)->length = (int)cVar54;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar33;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar37 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_scan_profile_avx2_256_8",pcVar37);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int8_t score = 0;
    int8_t matches = 0;
    int8_t similar = 0;
    int8_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m256i*)profile->profile8.score;
    pvPm = (__m256i*)profile->profile8.matches;
    pvPs = (__m256i*)profile->profile8.similar;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi8(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi8(_mm256_set1_epi8(position),
            _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31));
    vNegInfFront = vZero;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi8(segLen), 1);
    vNegInfFront = _mm256_insert_epi8_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi8(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi8(-segLen*gap), 1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi8(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi8(vGapper, vGapE);
            vGapperL = _mm256_adds_epi8(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 1);
        vHpM = _mm256_slli_si256_rpl(vHpM, 1);
        vHpS = _mm256_slli_si256_rpl(vHpS, 1);
        vHpL = _mm256_slli_si256_rpl(vHpL, 1);
        vHp = _mm256_insert_epi8_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi8(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi8(vH, vGapO);
            vE_ext = _mm256_subs_epi8(vE, vGapE);
            case1 = _mm256_cmpgt_epi8(vE_opn, vE_ext);
            vE = _mm256_max_epi8(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi8(vEL, vOne);
            vGapper = _mm256_adds_epi8(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi8(vF, vGapper),
                    _mm256_cmpeq_epi8(vF, vGapper));
            vF = _mm256_max_epi8(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi8(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi8(vHp, vW);
            vHpM = _mm256_adds_epi8(vHpM, vWM);
            vHpS = _mm256_adds_epi8(vHpS, vWS);
            vHpL = _mm256_adds_epi8(vHpL, vOne);
            case1 = _mm256_cmpgt_epi8(vE, vHp);
            vHt = _mm256_max_epi8(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 1);
        vHtM = _mm256_slli_si256_rpl(vHtM, 1);
        vHtS = _mm256_slli_si256_rpl(vHtS, 1);
        vHtL = _mm256_slli_si256_rpl(vHtL, 1);
        vHt = _mm256_insert_epi8_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi8(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi8(vGapper, vF),
                _mm256_cmpeq_epi8(vGapper, vF));
        vF = _mm256_max_epi8(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi8(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 1);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 1);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 1);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 1);
            vFt = _mm256_adds_epi8(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi8(vFt, vF),
                    _mm256_cmpeq_epi8(vFt, vF));
            vF = _mm256_max_epi8(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi8(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 1);
        vFM = _mm256_slli_si256_rpl(vFM, 1);
        vFS = _mm256_slli_si256_rpl(vFS, 1);
        vFL = _mm256_slli_si256_rpl(vFL, 1);
        vF = _mm256_adds_epi8(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi8(vF, vHt);
        vH = _mm256_max_epi8(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi8(vH, vGapO);
            vF_ext = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi8(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi8(vFL, vOne);
            vH = _mm256_max_epi8(vHp, vE);
            vH = _mm256_max_epi8(vH, vF);
            case1 = _mm256_cmpeq_epi8(vH, vHp);
            case2 = _mm256_cmpeq_epi8(vH, vF);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvH + offset);
            vHM = _mm256_load_si256(pvHM + offset);
            vHS = _mm256_load_si256(pvHS + offset);
            vHL = _mm256_load_si256(pvHL + offset);
            cond_max = _mm256_cmpgt_epi8(vH, vMaxH);
            vMaxH = _mm256_max_epi8(vMaxH, vH);
            vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
                vHM = _mm256_slli_si256_rpl(vHM, 1);
                vHS = _mm256_slli_si256_rpl(vHS, 1);
                vHL = _mm256_slli_si256_rpl(vHL, 1);
            }
            result->stats->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
            result->stats->rowcols->matches_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHM, 31);
            result->stats->rowcols->similar_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHS, 31);
            result->stats->rowcols->length_row[j] = (int8_t) _mm256_extract_epi8_rpl (vHL, 31);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 1);
            vMaxM = _mm256_slli_si256_rpl(vMaxM, 1);
            vMaxS = _mm256_slli_si256_rpl(vMaxS, 1);
            vMaxL = _mm256_slli_si256_rpl(vMaxL, 1);
        }
        end_query = s1Len-1;
        score = (int8_t) _mm256_extract_epi8_rpl(vMaxH, 31);
        matches = (int8_t) _mm256_extract_epi8_rpl(vMaxM, 31);
        similar = (int8_t) _mm256_extract_epi8_rpl(vMaxS, 31);
        length = (int8_t) _mm256_extract_epi8_rpl(vMaxL, 31);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvH;
        int8_t *m = (int8_t*)pvHM;
        int8_t *s = (int8_t*)pvHS;
        int8_t *l = (int8_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        __m256i vHM = _mm256_load_si256(pvHM + offset);
        __m256i vHS = _mm256_load_si256(pvHS + offset);
        __m256i vHL = _mm256_load_si256(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 1);
            vHM = _mm256_slli_si256_rpl(vHM, 1);
            vHS = _mm256_slli_si256_rpl(vHS, 1);
            vHL = _mm256_slli_si256_rpl(vHL, 1);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        matches = (int8_t) _mm256_extract_epi8_rpl (vHM, 31);
        similar = (int8_t) _mm256_extract_epi8_rpl (vHS, 31);
        length = (int8_t) _mm256_extract_epi8_rpl (vHL, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}